

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::TruncCaseInstance::getInputValues
          (TruncCaseInstance *this,int numValues,void **values)

{
  undefined4 uVar1;
  pointer pSVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Float<unsigned_int,_8,_23,_127,_3U> FVar7;
  void *pvVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  float fVar12;
  Random rnd;
  Float<unsigned_short,_5,_10,_15,_3U> local_76;
  float local_74;
  float local_70;
  Float<unsigned_int,_8,_23,_127,_3U> local_6c;
  ulong local_68;
  ulong local_60;
  float local_58 [6];
  deRandom local_40;
  
  local_58[0] = -2.0;
  local_58[1] = 2.0;
  local_58[2] = -1000.0;
  local_58[3] = 1000.0;
  local_58[4] = -1e+07;
  local_58[5] = 1e+07;
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar3 ^ 0xac23f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_68 = (ulong)*(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  iVar5 = 0;
  lVar9 = 0;
  do {
    if (0 < (int)uVar4) {
      uVar1 = (&DAT_00b2c5a0)[lVar9];
      pvVar8 = *values;
      uVar10 = (ulong)uVar4;
      iVar11 = iVar5;
      do {
        *(undefined4 *)((long)pvVar8 + (long)iVar11 * 4) = uVar1;
        iVar11 = iVar11 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
    }
    lVar9 = lVar9 + 1;
    iVar5 = iVar5 + uVar4;
  } while (lVar9 != 6);
  uVar6 = (numValues + -6) * uVar4;
  local_60 = (ulong)(uint)numValues;
  if (0 < (int)uVar6) {
    local_70 = local_58[local_68 * 2];
    pvVar8 = *values;
    local_74 = local_58[local_68 * 2 + 1] - local_70;
    uVar10 = 0;
    do {
      fVar12 = deRandom_getFloat(&local_40);
      *(float *)((long)pvVar8 + uVar10 * 4 + (long)(int)(uVar4 * 6) * 4) =
           fVar12 * local_74 + local_70;
      uVar10 = uVar10 + 1;
    } while (uVar6 != uVar10);
  }
  if (((int)local_68 == 1) && (uVar4 = uVar4 * (int)local_60, 0 < (int)uVar4)) {
    pvVar8 = *values;
    uVar10 = 0;
    do {
      local_6c.m_value = *(StorageType *)((long)pvVar8 + uVar10 * 4);
      local_76.m_value = 0;
      local_76 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>(&local_6c)
      ;
      FVar7 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>(&local_76);
      pvVar8 = *values;
      *(StorageType *)((long)pvVar8 + uVar10 * 4) = FVar7.m_value;
      uVar10 = uVar10 + 1;
    } while (uVar4 != uVar10);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(m_name) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const float				specialCases[]	= { 0.0f, -0.0f, -0.9f, 0.9f, 1.0f, -1.0f };
		const int				numSpecialCases	= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				((float*)values[0])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx];
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + scalarSize*numSpecialCases, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}